

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O1

char * el::LevelHelper::convertToString(Level level)

{
  if ((int)level < 0x10) {
    switch(level) {
    case Global:
      return "GLOBAL";
    case Trace:
      return "TRACE";
    case Debug:
      return "DEBUG";
    case Fatal:
      return "FATAL";
    }
  }
  else if ((int)level < 0x40) {
    if (level == Error) {
      return "ERROR";
    }
    if (level == Warning) {
      return "WARNING";
    }
  }
  else {
    if (level == Verbose) {
      return "VERBOSE";
    }
    if (level == Info) {
      return "INFO";
    }
  }
  return "UNKNOWN";
}

Assistant:

const char* LevelHelper::convertToString(Level level) {
  // Do not use switch over strongly typed enums because Intel C++ compilers dont support them yet.
  if (level == Level::Global) return "GLOBAL";
  if (level == Level::Debug) return "DEBUG";
  if (level == Level::Info) return "INFO";
  if (level == Level::Warning) return "WARNING";
  if (level == Level::Error) return "ERROR";
  if (level == Level::Fatal) return "FATAL";
  if (level == Level::Verbose) return "VERBOSE";
  if (level == Level::Trace) return "TRACE";
  return "UNKNOWN";
}